

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  u8 c;
  u64 uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  u8 *z;
  
  if ((zIn == (char *)0x0) ||
     ((p->nAlloc <= (ulong)N + p->nUsed + 2 && (iVar2 = jsonStringGrow(p,N + 2), iVar2 != 0)))) {
    return;
  }
  uVar1 = p->nUsed;
  p->nUsed = uVar1 + 1;
  p->zBuf[uVar1] = '\"';
  do {
    uVar4 = 0;
    if (3 < N) {
      uVar5 = 0;
      do {
        iVar2 = (int)uVar5;
        if ((((""[((u8 *)zIn)[uVar5]] == '\0') ||
             (uVar5 = (ulong)(iVar2 + 1), ""[((u8 *)zIn)[iVar2 + 1]] == '\0')) ||
            (uVar5 = (ulong)(iVar2 + 2), ""[((u8 *)zIn)[iVar2 + 2]] == '\0')) ||
           (uVar5 = (ulong)(iVar2 + 3U), ""[((u8 *)zIn)[iVar2 + 3U]] == '\0')) goto LAB_001bda67;
        uVar4 = (ulong)(iVar2 + 4U);
        uVar5 = (ulong)(iVar2 + 4U);
      } while (iVar2 + 7U < N);
    }
    uVar5 = uVar4;
    if ((uint)uVar4 < N) {
      do {
        uVar5 = uVar4;
        if (""[((u8 *)zIn)[uVar4]] == '\0') break;
        uVar4 = uVar4 + 1;
        uVar5 = (ulong)N;
      } while (N != (uint)uVar4);
    }
LAB_001bda67:
    uVar3 = (uint)uVar5;
    if (N < uVar3 || N - uVar3 == 0) {
      if (uVar3 != 0) {
        memcpy(p->zBuf + p->nUsed,zIn,uVar5 & 0xffffffff);
        p->nUsed = p->nUsed + (uVar5 & 0xffffffff);
      }
      uVar1 = p->nUsed;
      p->nUsed = uVar1 + 1;
      p->zBuf[uVar1] = '\"';
      return;
    }
    if (uVar3 != 0) {
      uVar5 = uVar5 & 0xffffffff;
      memcpy(p->zBuf + p->nUsed,zIn,uVar5);
      p->nUsed = p->nUsed + uVar5;
      zIn = (char *)((u8 *)zIn + uVar5);
      N = N - uVar3;
    }
    c = *zIn;
    if (c == '\\') {
LAB_001bdaac:
      if ((p->nAlloc < p->nUsed + (ulong)N + 3) && (iVar2 = jsonStringGrow(p,N + 3), iVar2 != 0)) {
        return;
      }
      uVar1 = p->nUsed;
      p->nUsed = uVar1 + 1;
      p->zBuf[uVar1] = '\\';
LAB_001bdae8:
      uVar1 = p->nUsed;
      p->nUsed = uVar1 + 1;
      p->zBuf[uVar1] = c;
    }
    else {
      if (c == '\'') goto LAB_001bdae8;
      if (c == '\"') goto LAB_001bdaac;
      if ((p->nAlloc < p->nUsed + (ulong)N + 7) && (iVar2 = jsonStringGrow(p,N + 7), iVar2 != 0)) {
        return;
      }
      jsonAppendControlChar(p,c);
    }
    zIn = (char *)((u8 *)zIn + 1);
    N = N - 1;
  } while( true );
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 k;
  u8 c;
  const u8 *z = (const u8*)zIn;
  if( z==0 ) return;
  if( (N+p->nUsed+2 >= p->nAlloc) && jsonStringGrow(p,N+2)!=0 ) return;
  p->zBuf[p->nUsed++] = '"';
  while( 1 /*exit-by-break*/ ){
    k = 0;
    /* The following while() is the 4-way unwound equivalent of
    **
    **     while( k<N && jsonIsOk[z[k]] ){ k++; }
    */
    while( 1 /* Exit by break */ ){
      if( k+3>=N ){
        while( k<N && jsonIsOk[z[k]] ){ k++; }
        break;
      }
      if( !jsonIsOk[z[k]] ){
        break;
      }
      if( !jsonIsOk[z[k+1]] ){
        k += 1;
        break;
      }
      if( !jsonIsOk[z[k+2]] ){
        k += 2;
        break;
      }
      if( !jsonIsOk[z[k+3]] ){
        k += 3;
        break;
      }else{
        k += 4;
      }
    }
    if( k>=N ){
      if( k>0 ){
        memcpy(&p->zBuf[p->nUsed], z, k);
        p->nUsed += k;
      }
      break;
    }
    if( k>0 ){
      memcpy(&p->zBuf[p->nUsed], z, k);
      p->nUsed += k;
      z += k;
      N -= k;
    }
    c = z[0];
    if( c=='"' || c=='\\' ){
      if( (p->nUsed+N+3 > p->nAlloc) && jsonStringGrow(p,N+3)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = c;
    }else if( c=='\'' ){
      p->zBuf[p->nUsed++] = c;
    }else{
      if( (p->nUsed+N+7 > p->nAlloc) && jsonStringGrow(p,N+7)!=0 ) return;
      jsonAppendControlChar(p, c);
    }
    z++;
    N--;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}